

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack16to8_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  float *k00_1;
  int j_1;
  int i_1;
  int k_1;
  int p_1;
  float *g00_1;
  float *k00;
  int j;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffa40;
  size_t in_stack_fffffffffffffa48;
  undefined8 in_stack_fffffffffffffa50;
  int _c;
  undefined8 in_stack_fffffffffffffa58;
  Mat *in_stack_fffffffffffffa60;
  undefined8 local_510;
  undefined8 local_508;
  undefined4 local_4e8;
  Allocator *in_stack_fffffffffffffb20;
  undefined4 uVar1;
  int in_stack_fffffffffffffb2c;
  undefined8 in_stack_fffffffffffffb30;
  Mat *in_stack_fffffffffffffb38;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined4 local_498;
  long local_490;
  undefined4 local_488;
  undefined4 local_484;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined8 local_470;
  undefined4 *local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined4 local_448;
  long *local_440;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined8 local_420;
  void *local_418;
  int local_410;
  int local_40c;
  int local_408;
  int local_404;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  long local_3e0;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined8 local_3c0;
  undefined4 *local_3b8;
  int local_3b0;
  void *local_3a0;
  int *local_398;
  long local_390;
  long *local_380;
  int local_374;
  int local_370;
  long local_360;
  int local_354;
  int local_348;
  int local_344;
  long *local_340;
  undefined8 *local_330;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_308;
  void **local_300;
  int local_2e0;
  undefined4 local_2dc;
  void **local_2d8;
  undefined8 *local_2c8;
  undefined8 *local_2a8;
  undefined8 *local_298;
  undefined8 *local_278;
  undefined1 local_26d;
  int local_26c;
  void **local_268;
  undefined8 *local_260;
  undefined1 local_23d;
  int local_23c;
  undefined8 *local_230;
  undefined1 local_20d;
  int local_20c;
  void **local_208;
  undefined8 *local_200;
  undefined1 local_1dd;
  int local_1dc;
  undefined8 *local_1d0;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  int local_13c;
  undefined8 *local_138;
  int local_12c;
  undefined8 *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  undefined4 *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  void *local_d0;
  undefined8 *local_b8;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  undefined4 *local_98;
  undefined4 local_8c;
  int local_88;
  int local_84;
  undefined8 *local_80;
  void *local_60;
  undefined8 *local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffa50 >> 0x20);
  local_354 = in_R8D * in_R9D;
  local_348 = in_ECX;
  local_344 = in_EDX;
  local_340 = in_RSI;
  Mat::reshape(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20),
               (int)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20);
  Mat::create(in_stack_fffffffffffffa60,(int)((ulong)in_stack_fffffffffffffa58 >> 0x20),
              (int)in_stack_fffffffffffffa58,_c,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40)
  ;
  for (local_3b0 = 0; local_3b0 + 0xf < local_348; local_3b0 = local_3b0 + 0x10) {
    local_1dc = local_3b0 / 0x10;
    local_1d0 = &local_400;
    local_f4 = *(int *)((long)local_340 + 0x2c);
    local_f8 = (int)local_340[6];
    local_fc = *(undefined4 *)((long)local_340 + 0x34);
    local_108 = (undefined4 *)(*local_340 + local_340[8] * (long)local_1dc * local_340[2]);
    local_110 = local_340[2];
    local_114 = (undefined4)local_340[3];
    local_120 = local_340[4];
    local_f0 = &local_400;
    local_8 = (long)local_f4 * (long)local_f8 * local_110;
    local_1a8 = &local_400;
    local_330 = &local_400;
    local_c = 0x10;
    local_1dd = 1;
    local_400 = 0;
    local_3f0 = 0;
    local_3e8 = 0;
    local_3d8 = 0;
    local_3d4 = 0;
    local_3d0 = 0;
    local_3cc = 0;
    local_3c8 = 0;
    local_3c0 = 0;
    local_3f8 = 0;
    local_3b8 = local_108;
    for (local_404 = 0; local_404 + 0xf < local_344; local_404 = local_404 + 0x10) {
      for (local_408 = 0; local_408 < local_354; local_408 = local_408 + 1) {
        for (local_40c = 0; local_40c < 0x10; local_40c = local_40c + 1) {
          for (local_410 = 0; local_410 < 0x10; local_410 = local_410 + 1) {
            local_20c = local_3b0 + local_410;
            local_200 = &local_460;
            local_208 = &local_3a0;
            local_d0 = (void *)((long)local_3a0 + local_360 * local_20c * local_390);
            local_b8 = &local_460;
            local_440 = local_380;
            local_18 = (long)local_374 * (long)local_370 * local_390;
            local_1c = 0x10;
            local_20d = 1;
            local_12c = local_404 + local_40c;
            local_128 = &local_460;
            local_418 = (void *)((long)local_d0 + (long)local_374 * (long)local_12c * local_390);
            local_320 = &local_460;
            local_460 = 0;
            local_450 = 0;
            local_448 = 0;
            local_438 = 0;
            local_434 = 0;
            local_430 = 0;
            local_42c = 0;
            local_428 = 0;
            local_420 = 0;
            local_458 = 0;
            *local_3b8 = *(undefined4 *)((long)local_418 + (long)local_408 * 4);
            local_3b8 = local_3b8 + 1;
            local_298 = local_320;
          }
        }
      }
    }
    local_278 = local_330;
    local_3e0 = local_120;
  }
  for (; local_3b0 + 7 < local_348; local_3b0 = local_3b0 + 8) {
    local_23c = local_3b0 / 0x10 +
                (int)((long)((ulong)(uint)((int)((long)local_3b0 % 0x10) >> 0x1f) << 0x20 |
                            (long)local_3b0 % 0x10 & 0xffffffffU) / 8);
    local_230 = &local_4b0;
    local_84 = *(int *)((long)local_340 + 0x2c);
    local_88 = (int)local_340[6];
    local_8c = *(undefined4 *)((long)local_340 + 0x34);
    local_98 = (undefined4 *)(*local_340 + local_340[8] * (long)local_23c * local_340[2]);
    local_a0 = local_340[2];
    local_a4 = (undefined4)local_340[3];
    local_b0 = local_340[4];
    local_80 = &local_4b0;
    local_28 = (long)local_84 * (long)local_88 * local_a0;
    local_1b0 = &local_4b0;
    local_318 = &local_4b0;
    local_2c = 0x10;
    local_23d = 1;
    local_4b0 = 0;
    local_4a0 = 0;
    local_498 = 0;
    local_488 = 0;
    local_484 = 0;
    local_480 = 0;
    local_47c = 0;
    local_478 = 0;
    local_470 = 0;
    local_4a8 = 0;
    local_468 = local_98;
    for (local_4b4 = 0; local_4b4 + 0xf < local_344; local_4b4 = local_4b4 + 0x10) {
      for (local_4b8 = 0; local_4b8 < local_354; local_4b8 = local_4b8 + 1) {
        for (local_4bc = 0; local_4bc < 0x10; local_4bc = local_4bc + 1) {
          for (local_4c0 = 0; local_4c0 < 8; local_4c0 = local_4c0 + 1) {
            local_26c = local_3b0 + local_4c0;
            local_260 = &local_510;
            local_268 = &local_3a0;
            local_60 = (void *)((long)local_3a0 + local_360 * local_26c * local_390);
            local_48 = &local_510;
            uVar1 = 1;
            local_38 = (long)local_374 * (long)(int)in_stack_fffffffffffffb20 * local_390;
            local_13c = local_4b4 + local_4bc;
            local_138 = &local_510;
            local_308 = &local_510;
            local_3c = 0x10;
            local_26d = 1;
            local_510 = 0;
            local_4e8 = 0;
            uVar1 = 0;
            local_508 = 0;
            *local_468 = *(undefined4 *)
                          ((long)local_60 +
                          (long)local_4b8 * 4 + (long)local_374 * (long)local_13c * local_390);
            local_468 = local_468 + 1;
            local_2c8 = local_308;
          }
        }
      }
    }
    local_2a8 = local_318;
    local_490 = local_b0;
  }
  local_300 = &local_3a0;
  if (local_398 != (int *)0x0) {
    local_2dc = 0xffffffff;
    LOCK();
    local_2e0 = *local_398;
    *local_398 = *local_398 + -1;
    UNLOCK();
    if (local_2e0 == 1) {
      local_2d8 = local_300;
      if (local_380 == (long *)0x0) {
        if (local_3a0 != (void *)0x0) {
          free(local_3a0);
        }
      }
      else {
        (**(code **)(*local_380 + 0x18))(local_380,local_3a0);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-16a-maxk-inch/16a-outch/16b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * 16 * maxk, inch / 16, outch / 16 + (outch % 16) / 8, (size_t)4u);

    int q = 0;
    for (; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}